

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_result_builder.hpp
# Opt level: O1

void __thiscall
Catch::ResultBuilder::ResultBuilder
          (ResultBuilder *this,char *macroName,SourceLineInfo *lineInfo,char *capturedExpression,
          Flags resultDisposition)

{
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,macroName,&local_69);
  std::__cxx11::string::string((string *)&local_68,capturedExpression,&local_6a);
  AssertionInfo::AssertionInfo
            (&this->m_assertionInfo,&local_48,lineInfo,&local_68,resultDisposition);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->m_data).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_data).reconstructedExpression.field_2;
  (this->m_data).reconstructedExpression._M_string_length = 0;
  (this->m_data).reconstructedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_data).message._M_dataplus._M_p = (pointer)&(this->m_data).message.field_2;
  (this->m_data).message._M_string_length = 0;
  (this->m_data).message.field_2._M_local_buf[0] = '\0';
  (this->m_data).resultType = Unknown;
  (this->m_exprComponents).testFalse = false;
  (this->m_exprComponents).lhs._M_dataplus._M_p = (pointer)&(this->m_exprComponents).lhs.field_2;
  (this->m_exprComponents).lhs._M_string_length = 0;
  (this->m_exprComponents).lhs.field_2._M_local_buf[0] = '\0';
  (this->m_exprComponents).rhs._M_dataplus._M_p = (pointer)&(this->m_exprComponents).rhs.field_2;
  (this->m_exprComponents).rhs._M_string_length = 0;
  (this->m_exprComponents).rhs.field_2._M_local_buf[0] = '\0';
  (this->m_exprComponents).op._M_dataplus._M_p = (pointer)&(this->m_exprComponents).op.field_2;
  (this->m_exprComponents).op._M_string_length = 0;
  (this->m_exprComponents).op.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  this->m_shouldDebugBreak = false;
  this->m_shouldThrow = false;
  return;
}

Assistant:

ResultBuilder::ResultBuilder(   char const* macroName,
                                    SourceLineInfo const& lineInfo,
                                    char const* capturedExpression,
                                    ResultDisposition::Flags resultDisposition )
    :   m_assertionInfo( macroName, lineInfo, capturedExpression, resultDisposition ),
        m_shouldDebugBreak( false ),
        m_shouldThrow( false )
    {}